

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<nwcpp::Dataflow*,char,nwcpp::Node_const*,nwcpp::Node_const*>::
load_impl_sequence<0ul,1ul,2ul,3ul>
          (argument_loader<nwcpp::Dataflow*,char,nwcpp::Node_const*,nwcpp::Node_const*> *this,
          long call)

{
  handle src;
  bool bVar1;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x58),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  if ((bVar1) && (src.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8), src.m_ptr != (PyObject *)0x0)
     ) {
    if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      if ((**(ulong **)(call + 0x20) & 2) == 0) {
        return false;
      }
      this[0x50] = (argument_loader<nwcpp::Dataflow*,char,nwcpp::Node_const*,nwcpp::Node_const*>)0x1
      ;
    }
    else {
      bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)(this + 0x30),src,SUB41(((uint)**(ulong **)(call + 0x20) & 2) >> 1,0));
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                      ((type_caster_generic *)(this + 0x18),
                       *(PyObject **)(*(long *)(call + 8) + 0x10),
                       SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
    if (bVar1) {
      bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                        ((type_caster_generic *)this,*(PyObject **)(*(long *)(call + 8) + 0x18),
                         SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }